

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O3

ChCoordsys<double> * __thiscall
chrono::ChLinkRevoluteTranslational::GetLinkRelativeCoords
          (ChCoordsys<double> *__return_storage_ptr__,ChLinkRevoluteTranslational *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ChBodyFrame *pCVar10;
  ChBodyFrame *pCVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  double local_b0;
  double local_38;
  double local_30;
  double local_28;
  
  pCVar10 = (this->super_ChLink).Body1;
  pCVar11 = (this->super_ChLink).Body2;
  ChTransform<double>::TransformLocalToParent
            (&this->m_p1,&(pCVar10->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar10->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  dVar18 = (this->m_x2).m_data[1];
  dVar27 = (this->m_y2).m_data[0];
  dVar30 = (this->m_x2).m_data[0];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar30;
  dVar31 = (this->m_y2).m_data[1];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar31;
  dVar19 = (this->m_y2).m_data[2];
  dVar1 = (this->m_x2).m_data[2];
  dVar2 = (pCVar11->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar3 = (pCVar11->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  dVar4 = (pCVar11->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar8 = *(undefined1 (*) [16])
            (pCVar11->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
            super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array;
  dVar13 = *(double *)
            ((long)&(pCVar11->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x18);
  dVar14 = *(double *)
            ((long)&(pCVar11->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x20);
  auVar9 = *(undefined1 (*) [16])
            ((long)&(pCVar11->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x30);
  dVar5 = *(double *)
           ((long)&(pCVar11->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x10);
  dVar6 = *(double *)
           ((long)&(pCVar11->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x28);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar6;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar6;
  dVar7 = *(double *)
           ((long)&(pCVar11->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar18;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar27;
  auVar15 = vmulsd_avx512f(auVar46,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar1;
  auVar16 = vmulsd_avx512f(auVar28,auVar42);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar19;
  auVar17 = vmulsd_avx512f(auVar44,auVar20);
  auVar15 = vfmsub231sd_fma(auVar15,auVar20,auVar28);
  auVar16 = vfmsub231sd_avx512f(auVar16,auVar41,auVar44);
  auVar17 = vfmsub231sd_avx512f(auVar17,auVar42,auVar46);
  dVar29 = auVar15._0_8_;
  dVar12 = dVar31 + dVar30 + dVar29;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar18;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar1;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar19;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar27;
  if (0.0 <= dVar12) {
    dVar12 = dVar12 + 1.0;
    if (dVar12 < 0.0) {
      auVar39._8_8_ = 0;
      auVar39._0_8_ = dVar6;
      vmovsd_avx512f(auVar39);
      vmovsd_avx512f(auVar15);
      vmovsd_avx512f(auVar43);
      vmovsd_avx512f(auVar45);
      vmovsd_avx512f(auVar16);
      vmovsd_avx512f(auVar47);
      vmovsd_avx512f(auVar17);
      dVar18 = sqrt(dVar12);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_e0;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_d8;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_d0;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_c8;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_c0;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_b8;
    }
    else {
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar12;
      auVar20 = vsqrtsd_avx(auVar22,auVar22);
      dVar18 = auVar20._0_8_;
      local_b0 = dVar6;
    }
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_b0;
    auVar16 = vsubsd_avx512f(auVar16,auVar43);
    auVar15 = vsubsd_avx512f(auVar15,auVar47);
    dVar31 = dVar18 * 0.5;
    dVar18 = 0.5 / dVar18;
    auVar17 = vsubsd_avx512f(auVar45,auVar17);
    dVar27 = auVar17._0_8_ * dVar18;
    dVar30 = auVar16._0_8_ * dVar18;
    dVar18 = auVar15._0_8_ * dVar18;
    goto LAB_005b042e;
  }
  if (dVar31 <= dVar30) {
    if (dVar30 < dVar29) goto LAB_005afef5;
    dVar18 = ((dVar30 - dVar31) - dVar29) + 1.0;
    if (dVar18 < 0.0) {
      vmovsd_avx512f(auVar38);
      vmovsd_avx512f(auVar15);
      vmovsd_avx512f(auVar43);
      vmovsd_avx512f(auVar45);
      vmovsd_avx512f(auVar16);
      vmovsd_avx512f(auVar47);
      vmovsd_avx512f(auVar17);
      dVar19 = sqrt(dVar18);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_e0;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_d8;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_d0;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_c8;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_c0;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_b8;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_b0;
    }
    else {
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar18;
      auVar20 = vsqrtsd_avx(auVar24,auVar24);
      dVar19 = auVar20._0_8_;
    }
    auVar16 = vaddsd_avx512f(auVar43,auVar16);
    auVar17 = vsubsd_avx512f(auVar45,auVar17);
    dVar31 = auVar17._0_8_;
    dVar27 = dVar19 * 0.5;
    dVar19 = 0.5 / dVar19;
    auVar15 = vaddsd_avx512f(auVar15,auVar47);
    dVar30 = auVar15._0_8_ * dVar19;
    dVar18 = auVar16._0_8_ * dVar19;
  }
  else if (dVar31 < dVar29) {
LAB_005afef5:
    dVar18 = ((dVar29 - dVar30) - dVar31) + 1.0;
    if (dVar18 < 0.0) {
      vmovsd_avx512f(auVar38);
      vmovsd_avx512f(auVar15);
      vmovsd_avx512f(auVar43);
      vmovsd_avx512f(auVar45);
      vmovsd_avx512f(auVar16);
      vmovsd_avx512f(auVar47);
      vmovsd_avx512f(auVar17);
      dVar19 = sqrt(dVar18);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_e0;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_d8;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_d0;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_c8;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_c0;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_b8;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_b0;
    }
    else {
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar18;
      auVar20 = vsqrtsd_avx(auVar23,auVar23);
      dVar19 = auVar20._0_8_;
    }
    auVar17 = vaddsd_avx512f(auVar45,auVar17);
    auVar15 = vsubsd_avx512f(auVar15,auVar47);
    dVar31 = auVar15._0_8_;
    dVar18 = dVar19 * 0.5;
    dVar19 = 0.5 / dVar19;
    auVar15 = vaddsd_avx512f(auVar43,auVar16);
    dVar27 = auVar15._0_8_ * dVar19;
    dVar30 = auVar17._0_8_ * dVar19;
  }
  else {
    dVar18 = ((dVar31 - dVar29) - dVar30) + 1.0;
    if (dVar18 < 0.0) {
      vmovsd_avx512f(auVar38);
      vmovsd_avx512f(auVar15);
      vmovsd_avx512f(auVar43);
      vmovsd_avx512f(auVar45);
      vmovsd_avx512f(auVar16);
      vmovsd_avx512f(auVar47);
      vmovsd_avx512f(auVar17);
      dVar19 = sqrt(dVar18);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_e0;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_d8;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_d0;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_c8;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_c0;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_b8;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_b0;
    }
    else {
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar18;
      auVar20 = vsqrtsd_avx(auVar21,auVar21);
      dVar19 = auVar20._0_8_;
    }
    auVar16 = vsubsd_avx512f(auVar16,auVar43);
    dVar31 = auVar16._0_8_;
    dVar30 = dVar19 * 0.5;
    dVar19 = 0.5 / dVar19;
    auVar16 = vaddsd_avx512f(auVar45,auVar17);
    dVar18 = auVar16._0_8_ * dVar19;
    auVar15 = vaddsd_avx512f(auVar15,auVar47);
    dVar27 = auVar15._0_8_ * dVar19;
  }
  dVar31 = dVar31 * dVar19;
LAB_005b042e:
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar7;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar5;
  dVar3 = local_30 - dVar3;
  dVar2 = local_38 - dVar2;
  dVar4 = local_28 - dVar4;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar3;
  auVar15 = vmulsd_avx512f(auVar34,auVar40);
  auVar35._0_8_ = dVar13 * dVar3;
  auVar35._8_8_ = dVar14 * dVar3;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar2;
  auVar15 = vfmadd213sd_fma(auVar37,auVar32,auVar15);
  auVar33._8_8_ = dVar2;
  auVar33._0_8_ = dVar2;
  auVar8 = vfmadd213pd_fma(auVar33,auVar8,auVar35);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar4;
  auVar15 = vfmadd213sd_fma(auVar36,auVar25,auVar15);
  auVar26._8_8_ = dVar4;
  auVar26._0_8_ = dVar4;
  auVar8 = vfmadd213pd_fma(auVar26,auVar9,auVar8);
  *(undefined1 (*) [16])(__return_storage_ptr__->pos).m_data = auVar8;
  (__return_storage_ptr__->pos).m_data[2] = auVar15._0_8_;
  (__return_storage_ptr__->rot).m_data[0] = dVar31;
  (__return_storage_ptr__->rot).m_data[1] = dVar27;
  (__return_storage_ptr__->rot).m_data[2] = dVar30;
  (__return_storage_ptr__->rot).m_data[3] = dVar18;
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<> ChLinkRevoluteTranslational::GetLinkRelativeCoords() {
    // Origin at P1 (center of revolute side) and orientation formed using
    // the mutually orthogonal direction x2 and y2.
    ChVector<> p = Body2->TransformPointParentToLocal(Body1->TransformPointLocalToParent(m_p1));
    ChMatrix33<> A(m_x2, m_y2, Vcross(m_x2, m_y2));

    return ChCoordsys<>(p, A.Get_A_quaternion());
}